

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ModuleEnumerator.cpp
# Opt level: O1

ModuleIterator * __thiscall
axl::spy::ModuleIterator::operator++
          (ModuleIterator *__return_storage_ptr__,ModuleIterator *this,int param_1)

{
  link_map *plVar1;
  
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&__return_storage_ptr__->m_moduleFileName,&this->m_moduleFileName);
  plVar1 = this->m_linkMap;
  __return_storage_ptr__->m_linkMap = plVar1;
  if (plVar1 != (link_map *)0x0) {
    this->m_linkMap = plVar1->l_next;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&this->m_moduleFileName);
  }
  return __return_storage_ptr__;
}

Assistant:

ModuleIterator
ModuleIterator::operator ++ (int) {
	ModuleIterator it = *this;
	operator ++ ();
	return it;
}